

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_mem.cpp
# Opt level: O1

void lzham::lzham_destroy_malloc_context(lzham_malloc_context context)

{
  if (context != (lzham_malloc_context)0x0) {
    if (*context != 0x5749abcd) {
      lzham_assert("p->m_sig == malloc_context::cSig",
                   "/workspace/llm4binary/github/license_c_cmakelists/richgel999[P]lzham_codec_devel/lzhamdecomp/lzham_mem.cpp"
                   ,0x102);
    }
    *(undefined4 *)context = 0xdeaddead;
    (*(code *)g_pRealloc)(context,0,0,1,g_pUser_data);
    return;
  }
  return;
}

Assistant:

void lzham_destroy_malloc_context(lzham_malloc_context context)
   {
      LZHAM_ASSERT(context);
      if (context)
      {
         malloc_context *p = static_cast<malloc_context *>(context);
         LZHAM_VERIFY(p->m_sig == malloc_context::cSig);

         lzham_print_mem_stats(p);
                           
         helpers::destruct(p);
         p->m_sig = 0xDEADDEAD;

         (*g_pRealloc)(p, 0, NULL, true, g_pUser_data);
      }
   }